

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O2

void __thiscall
MeshDenoisingViaL0Minimization::solveVertices
          (MeshDenoisingViaL0Minimization *this,TriMesh *mesh,MatrixXd *initial_vertices_matrix,
          vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
          *edge_vertex_handle,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *coef,vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                *delta,double alpha,double beta)

{
  size_t *this_00;
  size_t *this_01;
  size_t *this_02;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Nested pMVar5;
  _Rb_tree_color _Var6;
  int *piVar7;
  double *pdVar8;
  pointer pVVar9;
  bool bVar10;
  Index rows;
  Index cols;
  value_type _fh;
  value_type vVar11;
  mapped_type *pmVar12;
  _Base_ptr p_Var13;
  Scalar *pSVar14;
  _Self __tmp;
  PolyConnectivity *this_03;
  long row;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  VertexIter VVar20;
  undefined1 local_3c0 [8];
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  SparseMatrix<double,_0,_int> coef_matrix;
  map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
  vertex_coef;
  set<OpenMesh::EdgeHandle,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
  edge_handle;
  MatrixXd right_term;
  undefined1 auStack_108 [8];
  vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_> triple;
  undefined1 local_e8 [8];
  VertexHandle v3;
  undefined1 local_d0 [8];
  MatrixXd vertices_term;
  undefined1 local_88 [8];
  VertexIter v_it;
  double local_70;
  double local_68;
  double local_60;
  BaseHandle local_4c;
  DecompositionType *pDStack_48;
  VertexHandle v4;
  
  v_it._8_8_ = beta;
  pDStack_48 = (DecompositionType *)alpha;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count,initial_vertices_matrix);
  rows = (**(code **)(*(long *)&(mesh->super_Mesh).
                                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                .
                                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     + 0x10))(mesh);
  cols = (**(code **)(*(long *)&(mesh->super_Mesh).
                                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                .
                                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     + 0x10))(mesh);
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
            ((SparseMatrix<double,_0,_int> *)&solver.m_detPermR,rows,cols);
  auStack_108 = (undefined1  [8])0x0;
  triple.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  triple.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vertex_coef;
  vertex_coef._M_t._M_impl._0_4_ = 0;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&edge_handle;
  edge_handle._M_t._M_impl._0_4_ = 0;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  _local_88 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)mesh);
  this_00 = &vertex_coef._M_t._M_impl.super__Rb_tree_header._M_node_count;
  this_01 = &coef_matrix.m_data.m_allocatedSize;
  vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (DenseIndex)mesh;
  do {
    this_03 = (PolyConnectivity *)
              vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols;
    VVar20 = OpenMesh::PolyConnectivity::vertices_end
                       ((PolyConnectivity *)
                        vertices_term.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols);
    if ((local_88 == (undefined1  [8])VVar20.mesh_) &&
       (v_it.mesh_._0_4_ == (BaseHandle)VVar20.hnd_.super_BaseHandle.idx_)) {
      local_3c0 = auStack_108;
      local_d0 = (undefined1  [8])
                 triple.
                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      Eigen::SparseMatrix<double,0,int>::
      setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>>
                ((SparseMatrix<double,0,int> *)&solver.m_detPermR,
                 (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                  *)local_3c0,
                 (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                  *)local_d0);
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
                ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_3c0);
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
      analyzePattern((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                     local_3c0,(MatrixType *)&solver.m_detPermR);
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
                ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_3c0,(MatrixType *)&solver.m_detPermR);
      _local_e8 = (solve_retval_base<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   )Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>::
                    solve<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                              ((SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>
                                *)local_3c0,
                               (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                               &edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::internal::solve_retval_base<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_d0,
                 (ReturnByValue<Eigen::internal::solve_retval_base<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)local_e8);
      _local_88 = OpenMesh::PolyConnectivity::vertices_begin(this_03);
      while( true ) {
        VVar20 = OpenMesh::PolyConnectivity::vertices_end(this_03);
        if (v_it.mesh_._0_4_ == (BaseHandle)VVar20.hnd_.super_BaseHandle.idx_ &&
            local_88 == (undefined1  [8])VVar20.mesh_) break;
        row = (long)(int)v_it.mesh_._0_4_;
        pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                             local_d0,row,0);
        pDStack_48 = (DecompositionType *)*pSVar14;
        pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                             local_d0,row,1);
        pMVar5 = (Nested)*pSVar14;
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_d0,row,2);
        this_03 = (PolyConnectivity *)
                  vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols;
        _v3 = pMVar5;
        local_e8 = (undefined1  [8])pDStack_48;
        OpenMesh::
        AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
        set_point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   *)vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols,(VertexHandle)v_it.mesh_._0_4_,(Point *)local_e8);
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
        ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                      *)local_88,0);
      }
      free((void *)local_d0);
      Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
                ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_3c0);
      std::
      _Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
      ::~_Rb_tree((_Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
                   *)&vertex_coef._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_double>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_double>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
      ::~_Rb_tree((_Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_double>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_double>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                   *)&coef_matrix.m_data.m_allocatedSize);
      std::_Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
      ::~_Vector_base((_Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                       *)auStack_108);
      Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
                ((SparseMatrix<double,_0,_int> *)&solver.m_detPermR);
      free((void *)edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return;
    }
    std::
    _Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
    ::clear((_Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
             *)this_00);
    std::
    _Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_double>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_double>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
    ::clear((_Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_double>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_double>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
             *)this_01);
    pmVar12 = std::
              map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
              ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                            *)this_01,(key_type *)&v_it);
    *pmVar12 = 1.0;
    OpenMesh::PolyConnectivity::vf_iter
              ((VertexFaceIter *)local_3c0,this_03,(VertexHandle)v_it.mesh_._0_4_);
    while ((solver._4_4_ != -1 &&
           ((solver.m_info != solver._4_4_ || ((int)solver.m_lastError._M_dataplus._M_p == 0))))) {
      _fh = OpenMesh::Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
            ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                         *)local_3c0);
      OpenMesh::PolyConnectivity::fe_iter
                ((FaceEdgeIter *)local_d0,this_03,(FaceHandle)_fh.super_BaseHandle.idx_);
      while ((vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data._4_4_ != -1 &&
             (((int)vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data !=
               vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data._4_4_ ||
              ((int)vertices_term.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows == 0))))) {
        vVar11 = OpenMesh::Iterators::
                 GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                 ::operator*((FaceEdgeIter *)local_d0);
        local_e8._0_4_ = vVar11.super_BaseHandle.idx_;
        std::
        _Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
        ::_M_insert_unique<OpenMesh::EdgeHandle>
                  ((_Rb_tree<OpenMesh::EdgeHandle,_OpenMesh::EdgeHandle,_std::_Identity<OpenMesh::EdgeHandle>,_std::less<OpenMesh::EdgeHandle>,_std::allocator<OpenMesh::EdgeHandle>_>
                    *)this_00,(EdgeHandle *)local_e8);
        OpenMesh::Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
        ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::EdgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toEdgeHandle>
                      *)local_e8,(FaceEdgeIter *)local_d0,0);
      }
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)local_d0,
                   (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                    *)local_3c0,0);
    }
    local_68 = 0.0;
    local_70 = 0.0;
    local_60 = 0.0;
    for (p_Var13 = edge_handle._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var13 != (_Rb_tree_node_base *)&edge_handle;
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
      bVar10 = OpenMesh::PolyConnectivity::is_boundary
                         ((PolyConnectivity *)
                          vertices_term.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_cols,(EdgeHandle)p_Var13[1]._M_color);
      if (!bVar10) {
        _Var6 = p_Var13[1]._M_color;
        piVar7 = *(int **)&(edge_vertex_handle->
                           super__Vector_base<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[(int)_Var6].
                           super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                           ._M_impl.super__Vector_impl_data;
        local_3c0._0_4_ = *piVar7;
        local_d0._0_4_ = piVar7[1];
        local_e8._0_4_ = piVar7[2];
        local_4c.idx_ = piVar7[3];
        pdVar8 = (coef->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[(int)_Var6].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        dVar1 = *pdVar8;
        dVar2 = pdVar8[1];
        dVar16 = pdVar8[2];
        dVar3 = pdVar8[3];
        pVVar9 = (delta->
                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        dVar19 = pVVar9[(int)_Var6].super_VectorDataT<double,_3>.values_[0];
        dVar18 = pVVar9[(int)_Var6].super_VectorDataT<double,_3>.values_[1];
        dVar17 = pVVar9[(int)_Var6].super_VectorDataT<double,_3>.values_[2];
        if ((BaseHandle)*piVar7 == v_it.mesh_._0_4_) {
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)local_3c0);
          dVar4 = *pmVar12;
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)local_3c0);
          dVar15 = dVar1 * (double)v_it._8_8_;
          *pmVar12 = dVar15 * dVar1 + dVar4 + (double)pDStack_48;
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)local_d0);
          dVar4 = *pmVar12;
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)local_d0);
          *pmVar12 = dVar2 * dVar15 + (dVar4 - (double)pDStack_48);
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)local_e8);
          dVar2 = *pmVar12;
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)local_e8);
          *pmVar12 = dVar16 * dVar15 + dVar2 + (double)pDStack_48;
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)&local_4c);
          dVar2 = *pmVar12;
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)&local_4c);
          *pmVar12 = dVar15 * dVar3 + (dVar2 - (double)pDStack_48);
          dVar19 = dVar19 * (double)v_it._8_8_;
          dVar18 = dVar18 * (double)v_it._8_8_;
          dVar17 = dVar17 * (double)v_it._8_8_;
          dVar16 = dVar1;
LAB_00185d86:
          dVar19 = dVar19 * dVar16;
          dVar18 = dVar18 * dVar16;
          dVar17 = dVar17 * dVar16;
        }
        else {
          if ((BaseHandle)piVar7[1] == v_it.mesh_._0_4_) {
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)local_3c0);
            dVar4 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)local_3c0);
            dVar15 = dVar2 * (double)v_it._8_8_;
            *pmVar12 = dVar1 * dVar15 + (dVar4 - (double)pDStack_48);
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)local_d0);
            dVar1 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)local_d0);
            *pmVar12 = dVar15 * dVar2 + dVar1 + (double)pDStack_48;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)local_e8);
            dVar1 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)local_e8);
            *pmVar12 = dVar16 * dVar15 + (dVar1 - (double)pDStack_48);
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)&local_4c);
            dVar1 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)&local_4c);
            *pmVar12 = dVar15 * dVar3 + dVar1 + (double)pDStack_48;
            dVar19 = dVar19 * (double)v_it._8_8_;
            dVar18 = dVar18 * (double)v_it._8_8_;
            dVar17 = dVar17 * (double)v_it._8_8_;
            dVar16 = dVar2;
            goto LAB_00185d86;
          }
          if ((BaseHandle)piVar7[2] == v_it.mesh_._0_4_) {
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)local_3c0);
            dVar4 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)local_3c0);
            dVar15 = dVar16 * (double)v_it._8_8_;
            *pmVar12 = dVar1 * dVar15 + dVar4 + (double)pDStack_48;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)local_d0);
            dVar1 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)local_d0);
            *pmVar12 = dVar2 * dVar15 + (dVar1 - (double)pDStack_48);
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)local_e8);
            dVar1 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)local_e8);
            *pmVar12 = dVar15 * dVar16 + dVar1 + (double)pDStack_48;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)&local_4c);
            dVar1 = *pmVar12;
            pmVar12 = std::
                      map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                      ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                    *)this_01,(key_type *)&local_4c);
            *pmVar12 = dVar15 * dVar3 + (dVar1 - (double)pDStack_48);
            dVar19 = dVar19 * (double)v_it._8_8_;
            dVar18 = dVar18 * (double)v_it._8_8_;
            dVar17 = dVar17 * (double)v_it._8_8_;
            goto LAB_00185d86;
          }
          if ((BaseHandle)local_4c.idx_ != v_it.mesh_._0_4_) goto LAB_00185dbc;
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)local_3c0);
          dVar4 = *pmVar12;
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)local_3c0);
          dVar15 = dVar3 * (double)v_it._8_8_;
          *pmVar12 = dVar1 * dVar15 + (dVar4 - (double)pDStack_48);
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)local_d0);
          dVar1 = *pmVar12;
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)local_d0);
          *pmVar12 = dVar2 * dVar15 + dVar1 + (double)pDStack_48;
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)local_e8);
          dVar1 = *pmVar12;
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)local_e8);
          *pmVar12 = dVar16 * dVar15 + (dVar1 - (double)pDStack_48);
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)&local_4c);
          dVar1 = *pmVar12;
          pmVar12 = std::
                    map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                    ::operator[]((map<OpenMesh::VertexHandle,_double,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_double>_>_>
                                  *)this_01,(key_type *)&local_4c);
          *pmVar12 = dVar15 * dVar3 + dVar1 + (double)pDStack_48;
          dVar19 = dVar19 * (double)v_it._8_8_ * dVar3;
          dVar18 = dVar18 * (double)v_it._8_8_ * dVar3;
          dVar17 = dVar17 * (double)v_it._8_8_ * dVar3;
        }
        local_68 = local_68 + dVar19;
        local_70 = local_70 + dVar18;
        local_60 = local_60 + dVar17;
      }
LAB_00185dbc:
    }
    this_02 = &edge_handle._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_02,
                         (long)(int)v_it.mesh_._0_4_,0);
    *pSVar14 = local_68 + *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_02,
                         (long)(int)v_it.mesh_._0_4_,1);
    *pSVar14 = local_70 + *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_02,
                         (long)(int)v_it.mesh_._0_4_,2);
    *pSVar14 = local_60 + *pSVar14;
    for (p_Var13 = vertex_coef._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var13 != (_Rb_tree_node_base *)&vertex_coef;
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
      local_3c0._4_4_ = p_Var13[1]._M_color;
      local_3c0._0_4_ = v_it.mesh_._0_4_;
      solver._0_8_ = p_Var13[1]._M_parent;
      std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
      emplace_back<Eigen::Triplet<double,int>>
                ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
                 auStack_108,(Triplet<double,_int> *)local_3c0);
    }
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  *)local_88,0);
  } while( true );
}

Assistant:

void MeshDenoisingViaL0Minimization::solveVertices(TriMesh &mesh, Eigen::MatrixXd &initial_vertices_matrix,
                                                   std::vector< std::vector<TriMesh::VertexHandle> > &edge_vertex_handle,
                                                   std::vector< std::vector<double> > &coef, std::vector<TriMesh::Point> &delta,
                                                   double alpha, double beta)
{
    Eigen::MatrixXd right_term = initial_vertices_matrix;
    Eigen::SparseMatrix<double> coef_matrix((int)mesh.n_vertices(), (int)mesh.n_vertices());

    std::vector< Eigen::Triplet<double> > triple; triple.clear();

    std::map<TriMesh::VertexHandle, double> vertex_coef;
    std::set<TriMesh::EdgeHandle> edge_handle;;
    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        edge_handle.clear();
        vertex_coef.clear();
        vertex_coef[*v_it] = 1.0;
        for(TriMesh::VertexFaceIter vf_it = mesh.vf_iter(*v_it); vf_it.is_valid(); vf_it++)
        {
            for(TriMesh::FaceEdgeIter fe_it = mesh.fe_iter(*vf_it); fe_it.is_valid(); fe_it++)
            {
                edge_handle.insert(*fe_it);
            }
        }

        TriMesh::Point right(0.0, 0.0, 0.0);
        for(std::set<TriMesh::EdgeHandle>::iterator s_it = edge_handle.begin(); s_it != edge_handle.end(); s_it++)
        {
            if(!mesh.is_boundary(*s_it))
            {
                int index = (*s_it).idx();
                TriMesh::VertexHandle v1 = edge_vertex_handle[index][0],
                        v2 = edge_vertex_handle[index][1],
                        v3 = edge_vertex_handle[index][2],
                        v4 = edge_vertex_handle[index][3];
                double coe1 = coef[index][0],
                        coe2 = coef[index][1],
                        coe3 = coef[index][2],
                        coe4 = coef[index][3];
                TriMesh::Point temp_delta = delta[index];
                if(v1 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] + alpha + beta * coe1 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] - alpha + beta * coe1 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] + alpha + beta * coe1 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] - alpha + beta * coe1 * coe4;
                    right += temp_delta * beta * coe1;
                }
                else if(v2 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] - alpha + beta * coe2 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] + alpha + beta * coe2 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] - alpha + beta * coe2 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] + alpha + beta * coe2 * coe4;
                    right += temp_delta * beta * coe2;
                }
                else if(v3 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] + alpha + beta * coe3 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] - alpha + beta * coe3 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] + alpha + beta * coe3 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] - alpha + beta * coe3 * coe4;
                    right += temp_delta * beta * coe3;
                }
                else if(v4 == *v_it)
                {
                    vertex_coef[v1] = vertex_coef[v1] - alpha + beta * coe4 * coe1;
                    vertex_coef[v2] = vertex_coef[v2] + alpha + beta * coe4 * coe2;
                    vertex_coef[v3] = vertex_coef[v3] - alpha + beta * coe4 * coe3;
                    vertex_coef[v4] = vertex_coef[v4] + alpha + beta * coe4 * coe4;
                    right += temp_delta * beta * coe4;
                }
            }
        }
        right_term(v_it->idx(), 0) += right[0];
        right_term(v_it->idx(), 1) += right[1];
        right_term(v_it->idx(), 2) += right[2];

        for(std::map<TriMesh::VertexHandle, double>::iterator m_it = vertex_coef.begin(); m_it != vertex_coef.end(); m_it++)
        {
            triple.push_back(Eigen::Triplet<double>(v_it->idx(), m_it->first.idx(), m_it->second));
        }
    }
    coef_matrix.setFromTriplets(triple.begin(), triple.end());

    Eigen::SparseLU<Eigen::SparseMatrix<double> > solver;
    solver.analyzePattern(coef_matrix);
    solver.factorize(coef_matrix);
    Eigen::MatrixXd vertices_term = solver.solve(right_term);

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        int index = v_it->idx();
        TriMesh::Point pt = TriMesh::Point(vertices_term(index,0), vertices_term(index,1), vertices_term(index,2));
        mesh.set_point(*v_it, pt);
    }
}